

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O3

void __thiscall
ZXing::Pdf417::ModulusPoly::divide
          (ModulusPoly *this,ModulusPoly *other,ModulusPoly *quotient,ModulusPoly *remainder)

{
  ModulusGF *pMVar1;
  pointer psVar2;
  pointer piVar3;
  pointer piVar4;
  ModulusPoly *pMVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  invalid_argument *this_00;
  int *piVar9;
  int coefficient;
  ulong uVar10;
  ulong uVar11;
  ModulusPoly term;
  ModulusPoly iterationQuotient;
  ModulusPoly local_a8;
  long local_80;
  ModulusPoly *local_78;
  ModulusPoly local_70;
  ModulusPoly local_50;
  
  pMVar1 = this->_field;
  if (pMVar1 == other->_field) {
    piVar8 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish == piVar8) {
LAB_00174f4a:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    if (*piVar8 != 0) {
      quotient->_field = (pMVar1->_zero)._field;
      std::vector<int,_std::allocator<int>_>::operator=
                (&quotient->_coefficients,&(pMVar1->_zero)._coefficients);
      remainder->_field = this->_field;
      std::vector<int,_std::allocator<int>_>::operator=
                (&remainder->_coefficients,&this->_coefficients);
      iVar6 = ModulusPoly::coefficient
                        (other,(int)((ulong)((long)(other->_coefficients).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(other->_coefficients).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2) +
                               -1);
      iVar6 = ModulusGF::inverse(this->_field,iVar6);
      piVar8 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar11 = (ulong)((long)piVar9 - (long)piVar8) >> 2;
      uVar10 = (ulong)((long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2;
      if ((int)uVar10 <= (int)uVar11) {
        local_80 = (long)iVar6;
        local_78 = quotient;
        do {
          if (piVar9 == piVar8) goto LAB_00174f4a;
          if (*piVar8 == 0) {
            return;
          }
          pMVar1 = this->_field;
          iVar7 = ModulusPoly::coefficient(remainder,(int)uVar11 + -1);
          coefficient = 0;
          if ((iVar6 != 0) && (iVar7 != 0)) {
            psVar2 = (pMVar1->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            coefficient = (int)(pMVar1->_expTable).super__Vector_base<short,_std::allocator<short>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(long)psVar2[iVar7] + (long)psVar2[local_80]];
          }
          iVar7 = (int)uVar11 - (int)uVar10;
          multiplyByMonomial(&local_70,other,iVar7,coefficient);
          ModulusGF::buildMonomial(&local_50,this->_field,iVar7,coefficient);
          pMVar5 = local_78;
          add(&local_a8,local_78,&local_50);
          piVar3 = (pMVar5->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (pMVar5->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pMVar5->_field = local_a8._field;
          (pMVar5->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          (pMVar5->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (pMVar5->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((piVar3 != (pointer)0x0) &&
             (operator_delete(piVar3,(long)piVar4 - (long)piVar3),
             local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          subtract(&local_a8,remainder,&local_70);
          piVar3 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          remainder->_field = local_a8._field;
          (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((piVar3 != (pointer)0x0) &&
             (operator_delete(piVar3,(long)piVar4 - (long)piVar3),
             local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_a8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_50._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_50._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_70._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_70._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          piVar8 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar11 = (ulong)((long)piVar9 - (long)piVar8) >> 2;
          uVar10 = (ulong)((long)(other->_coefficients).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2;
        } while ((int)uVar10 <= (int)uVar11);
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Divide by 0");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field")
    ;
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
ModulusPoly::divide(const ModulusPoly& other, ModulusPoly& quotient, ModulusPoly& remainder) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (other.isZero()) {
		throw std::invalid_argument("Divide by 0");
	}

	quotient = _field->zero();
	remainder = *this;

	int denominatorLeadingTerm = other.coefficient(other.degree());
	int inverseDenominatorLeadingTerm = _field->inverse(denominatorLeadingTerm);

	while (remainder.degree() >= other.degree() && !remainder.isZero()) {
		int degreeDifference = remainder.degree() - other.degree();
		int scale = _field->multiply(remainder.coefficient(remainder.degree()), inverseDenominatorLeadingTerm);
		ModulusPoly term = other.multiplyByMonomial(degreeDifference, scale);
		ModulusPoly iterationQuotient = _field->buildMonomial(degreeDifference, scale);
		quotient = quotient.add(iterationQuotient);
		remainder = remainder.subtract(term);
	}
}